

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

AttVal * prvTidyRepairAttrValue(TidyDocImpl *doc,Node *node,ctmbstr name,ctmbstr value)

{
  Dict *pDVar1;
  AttVal *old;
  ctmbstr value_local;
  ctmbstr name_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  doc_local = (TidyDocImpl *)prvTidyGetAttrByName(node,name);
  if (doc_local == (TidyDocImpl *)0x0) {
    doc_local = (TidyDocImpl *)prvTidyAddAttribute(doc,node,name,value);
  }
  else {
    if ((doc_local->root).was != (Dict *)0x0) {
      (*doc->allocator->vtbl->free)(doc->allocator,(doc_local->root).was);
    }
    if (value == (ctmbstr)0x0) {
      (doc_local->root).was = (Dict *)0x0;
    }
    else {
      pDVar1 = (Dict *)prvTidytmbstrdup(doc->allocator,value);
      (doc_local->root).was = pDVar1;
    }
  }
  return (AttVal *)doc_local;
}

Assistant:

AttVal* TY_(RepairAttrValue)(TidyDocImpl* doc, Node* node, ctmbstr name, ctmbstr value)
{
    AttVal* old = TY_(GetAttrByName)(node, name);

    if (old)
    {
        if (old->value)
            TidyDocFree(doc, old->value);
        if (value)
            old->value = TY_(tmbstrdup)(doc->allocator, value);
        else
            old->value = NULL;

        return old;
    }
    else
        return TY_(AddAttribute)(doc, node, name, value);
}